

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  char cVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  string desc;
  string __str;
  long *local_130;
  long local_120;
  long lStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  string local_f0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  uint local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_d0 = local_c0;
  pcVar2 = (app->description_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + (app->description_)._M_string_length);
  uVar12 = app->require_option_min_;
  uVar10 = app->require_option_max_;
  if (app->required_ == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"REQUIRED","");
    FormatterBase::get_label(&local_f0,&this->super_FormatterBase,&local_50);
    puVar5 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x13207d);
    puVar7 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar7) {
      local_100 = *puVar7;
      uStack_f8 = puVar5[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *puVar7;
      local_110 = (undefined8 *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_110);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_120 = *plVar8;
      lStack_118 = plVar6[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar8;
      local_130 = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (uVar12 == 0) {
    if (uVar10 == 0) goto LAB_0010ee8e;
    cVar13 = '\x01';
    if (9 < uVar10) {
      uVar12 = uVar10;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (uVar12 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0010e94b;
        }
        if (uVar12 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0010e94b;
        }
        if (uVar12 < 10000) goto LAB_0010e94b;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar4 = cVar13 + '\x04';
      } while (bVar3);
      cVar13 = cVar13 + '\x01';
    }
LAB_0010e94b:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_f0._M_dataplus._M_p,(uint)local_f0._M_string_length,uVar10);
    puVar5 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1320d5);
    local_110 = &local_100;
    puVar7 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar7) {
      local_100 = *puVar7;
      uStack_f8 = puVar5[3];
    }
    else {
      local_100 = *puVar7;
      local_110 = (undefined8 *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
    local_130 = &local_120;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_120 = *plVar6;
      lStack_118 = puVar5[3];
    }
    else {
      local_120 = *plVar6;
      local_130 = (long *)*puVar5;
    }
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
LAB_0010ee61:
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    _Var15._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0010ee8e;
  }
  else {
    cVar13 = '\x01';
    if (uVar10 == uVar12) {
      if (9 < uVar12) {
        uVar10 = uVar12;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (uVar10 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0010e849;
          }
          if (uVar10 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0010e849;
          }
          if (uVar10 < 10000) goto LAB_0010e849;
          bVar3 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar3);
        cVar13 = cVar13 + '\x01';
      }
LAB_0010e849:
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_f0._M_dataplus._M_p,(uint)local_f0._M_string_length,uVar12);
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x132082);
      local_110 = &local_100;
      puVar7 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar7) {
        local_100 = *puVar7;
        uStack_f8 = puVar5[3];
      }
      else {
        local_100 = *puVar7;
        local_110 = (undefined8 *)*puVar5;
      }
      local_108 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
      local_130 = &local_120;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_120 = *plVar6;
        lStack_118 = puVar5[3];
      }
      else {
        local_120 = *plVar6;
        local_130 = (long *)*puVar5;
      }
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
      goto LAB_0010ee61;
    }
    if (uVar10 == 0) {
      if (9 < uVar12) {
        uVar10 = uVar12;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (uVar10 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0010ed6b;
          }
          if (uVar10 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0010ed6b;
          }
          if (uVar10 < 10000) goto LAB_0010ed6b;
          bVar3 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar3);
        cVar13 = cVar13 + '\x01';
      }
LAB_0010ed6b:
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_f0._M_dataplus._M_p,(uint)local_f0._M_string_length,uVar12);
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x1320c8);
      local_110 = &local_100;
      puVar7 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar7) {
        local_100 = *puVar7;
        uStack_f8 = puVar5[3];
      }
      else {
        local_100 = *puVar7;
        local_110 = (undefined8 *)*puVar5;
      }
      local_108 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
      local_130 = &local_120;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_120 = *plVar6;
        lStack_118 = puVar5[3];
      }
      else {
        local_120 = *plVar6;
        local_130 = (long *)*puVar5;
      }
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
      goto LAB_0010ee61;
    }
    if (9 < uVar12) {
      uVar9 = uVar12;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (uVar9 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0010ea4d;
        }
        if (uVar9 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0010ea4d;
        }
        if (uVar9 < 10000) goto LAB_0010ea4d;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar4 = cVar13 + '\x04';
      } while (bVar3);
      cVar13 = cVar13 + '\x01';
    }
LAB_0010ea4d:
    local_70 = &local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_70->_M_local_buf,local_68,uVar12);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1320b6);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_90);
    paVar1 = &local_f0.field_2;
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_f0.field_2._M_allocated_capacity = *puVar11;
      local_f0.field_2._8_8_ = plVar6[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar11;
      local_f0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_f0._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar13 = '\x01';
    if (9 < uVar10) {
      uVar12 = uVar10;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (uVar12 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0010eba0;
        }
        if (uVar12 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0010eba0;
        }
        if (uVar12 < 10000) goto LAB_0010eba0;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar4 = cVar13 + '\x04';
      } while (bVar3);
      cVar13 = cVar13 + '\x01';
    }
LAB_0010eba0:
    local_b0 = local_a0;
    ::std::__cxx11::string::_M_construct((ulong)&local_b0,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,uVar10);
    uVar12 = CONCAT44(uStack_a4,local_a8) + local_f0._M_string_length;
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      uVar14 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < uVar12) {
      uVar10 = 0xf;
      if (local_b0 != local_a0) {
        uVar10 = local_a0[0];
      }
      if (uVar10 < uVar12) goto LAB_0010ec1a;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
    }
    else {
LAB_0010ec1a:
      puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0);
    }
    local_110 = &local_100;
    puVar7 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar7) {
      local_100 = *puVar7;
      uStack_f8 = puVar5[3];
    }
    else {
      local_100 = *puVar7;
      local_110 = (undefined8 *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)puVar7 = 0;
    puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_120 = *plVar6;
      lStack_118 = puVar5[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar6;
      local_130 = (long *)*puVar5;
    }
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    _Var15._M_p = (pointer)local_70;
    if (local_70 == &local_60) goto LAB_0010ee8e;
  }
  operator_delete(_Var15._M_p);
LAB_0010ee8e:
  if (local_c8 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_d0,local_d0 + local_c8);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();

    if(app->get_required()) {
        desc += " " + get_label("REQUIRED") + " ";
    }

    if(min_options > 0) {
        if(max_options == min_options) {
            desc += " \n[Exactly " + std::to_string(min_options) + " of the following options are required]";
        } else if(max_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the following options are required]";
        } else {
            desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
        }
    } else if(max_options > 0) {
        desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
    }

    return (!desc.empty()) ? desc + "\n\n" : std::string{};
}